

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateScaleFactors
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          )

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  short **ppsVar4;
  int *piVar5;
  short *psVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double dVar29;
  undefined1 auVar20 [16];
  
  if ((this->kFlags & 0x80) == 0) {
    if (0 < count) {
      uVar19 = 0;
      pfVar2 = this->gScaleBuffers[cumulativeScalingIndex];
      iVar16 = this->kPatternCount;
      do {
        if (0 < iVar16) {
          lVar17 = 0;
          pfVar3 = this->gScaleBuffers[scalingIndices[uVar19]];
          do {
            if ((this->kFlags & 0x400) == 0) {
              dVar29 = log((double)pfVar3[lVar17]);
              pfVar2[lVar17] = (float)(dVar29 + (double)pfVar2[lVar17]);
              iVar16 = this->kPatternCount;
            }
            else {
              pfVar2[lVar17] = pfVar3[lVar17] + pfVar2[lVar17];
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < iVar16);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  else {
    pfVar2 = *this->gScaleBuffers;
    uVar1 = this->kPatternCount;
    if (0 < (int)uVar1) {
      memset(pfVar2,0,(ulong)uVar1 * 4);
    }
    if (0 < count) {
      auVar24 = vbroadcastsd_avx512f(ZEXT816(0x3fe62e42fefa39ef));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      iVar16 = this->kTipCount;
      ppsVar4 = this->gAutoScaleBuffers;
      piVar5 = this->gActiveScalingFactors;
      auVar26 = vpbroadcastq_avx512f();
      uVar19 = 0;
      do {
        lVar17 = (long)scalingIndices[uVar19] - (long)iVar16;
        if ((piVar5[lVar17] != 0) && (0 < (int)uVar1)) {
          psVar6 = ppsVar4[lVar17];
          uVar18 = 0;
          do {
            auVar27 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar27,auVar25);
            uVar15 = vpcmpuq_avx512f(auVar27,auVar26,2);
            auVar20 = vmovdqu16_avx512vl(*(undefined1 (*) [16])(psVar6 + uVar18));
            bVar7 = (byte)uVar15;
            auVar21._2_2_ = (ushort)((byte)(uVar15 >> 1) & 1) * auVar20._2_2_;
            auVar21._0_2_ = (ushort)(bVar7 & 1) * auVar20._0_2_;
            auVar21._4_2_ = (ushort)((byte)(uVar15 >> 2) & 1) * auVar20._4_2_;
            auVar21._6_2_ = (ushort)((byte)(uVar15 >> 3) & 1) * auVar20._6_2_;
            auVar21._8_2_ = (ushort)((byte)(uVar15 >> 4) & 1) * auVar20._8_2_;
            auVar21._10_2_ = (ushort)((byte)(uVar15 >> 5) & 1) * auVar20._10_2_;
            auVar21._12_2_ = (ushort)((byte)(uVar15 >> 6) & 1) * auVar20._12_2_;
            auVar21._14_2_ = (ushort)(byte)(uVar15 >> 7) * auVar20._14_2_;
            pfVar3 = pfVar2 + uVar18;
            auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * (int)pfVar3[1];
            auVar22._0_4_ = (uint)(bVar7 & 1) * (int)*pfVar3;
            auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * (int)pfVar3[2];
            auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * (int)pfVar3[3];
            auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * (int)pfVar3[4];
            auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * (int)pfVar3[5];
            auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * (int)pfVar3[6];
            auVar22._28_4_ = (uint)(byte)(uVar15 >> 7) * (int)pfVar3[7];
            auVar23 = vpmovsxwd_avx2(auVar21);
            auVar27 = vcvtps2pd_avx512f(auVar22);
            auVar28 = vcvtdq2pd_avx512f(auVar23);
            auVar27 = vfmadd231pd_avx512f(auVar27,auVar28,auVar24);
            auVar23 = vcvtpd2ps_avx512f(auVar27);
            pfVar3 = pfVar2 + uVar18;
            bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar15 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar15 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            bVar14 = SUB81(uVar15 >> 7,0);
            *pfVar3 = (float)((uint)(bVar7 & 1) * auVar23._0_4_ |
                             (uint)!(bool)(bVar7 & 1) * (int)*pfVar3);
            pfVar3[1] = (float)((uint)bVar8 * auVar23._4_4_ | (uint)!bVar8 * (int)pfVar3[1]);
            pfVar3[2] = (float)((uint)bVar9 * auVar23._8_4_ | (uint)!bVar9 * (int)pfVar3[2]);
            pfVar3[3] = (float)((uint)bVar10 * auVar23._12_4_ | (uint)!bVar10 * (int)pfVar3[3]);
            pfVar3[4] = (float)((uint)bVar11 * auVar23._16_4_ | (uint)!bVar11 * (int)pfVar3[4]);
            pfVar3[5] = (float)((uint)bVar12 * auVar23._20_4_ | (uint)!bVar12 * (int)pfVar3[5]);
            pfVar3[6] = (float)((uint)bVar13 * auVar23._24_4_ | (uint)!bVar13 * (int)pfVar3[6]);
            pfVar3[7] = (float)((uint)bVar14 * auVar23._28_4_ | (uint)!bVar14 * (int)pfVar3[7]);
            uVar18 = uVar18 + 8;
          } while ((uVar1 + 7 & 0xfffffff8) != uVar18);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactors(const int* scalingIndices,
                                                int  count,
                                                int  cumulativeScalingIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[0];
        for(int j=0; j<kPatternCount; j++)
            cumulativeScaleBuffer[j] =  0;
        for(int i=0; i<count; i++) {
            int sIndex = scalingIndices[i] - kTipCount;
            if (gActiveScalingFactors[sIndex]) {
                const signed short* scaleBuffer = gAutoScaleBuffers[sIndex];
                for(int j=0; j<kPatternCount; j++) {
                    cumulativeScaleBuffer[j] += M_LN2 * scaleBuffer[j];
                }
            }
        }

    } else {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=0; j<kPatternCount; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr,"Accumulating %d scale buffers into #%d\n",count,cumulativeScalingIndex);
            for(int j=0; j<kPatternCount; j++) {
                fprintf(stderr,"cumulativeScaleBuffer[%d] = %2.5e\n",j,cumulativeScaleBuffer[j]);
            }
        }
    }

    return BEAGLE_SUCCESS;
}